

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  bool bVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  if (this->Locked != true) {
    if ((this->ConfigData).Size == 0) {
      AddFontDefault(this,(ImFontConfig *)0x0);
    }
    if (this->FontBuilderIO == (ImFontBuilderIO *)0x0) {
      UNRECOVERED_JUMPTABLE = ImFontAtlasBuildWithStbTruetype;
      ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
    }
    else {
      UNRECOVERED_JUMPTABLE = this->FontBuilderIO->FontBuilder_Build;
    }
    bVar1 = (*UNRECOVERED_JUMPTABLE)(this);
    return bVar1;
  }
  __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_draw.cpp"
                ,0x8d7,"bool ImFontAtlas::Build()");
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Default font is none are specified
    if (ConfigData.Size == 0)
        AddFontDefault();

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}